

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void FromWabtValueTypes(ValueTypes *types,wasm_valtype_vec_t *out)

{
  wasm_valkind_t kind;
  pointer pTVar1;
  ValueType *pVVar2;
  ValueType VVar3;
  ulong uVar4;
  
  wasm_valtype_vec_new_uninitialized
            (out,(long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3);
  pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
      super__Vector_impl_data._M_finish != pTVar1) {
    uVar4 = 0;
    do {
      kind = FromWabtValueType(pTVar1[uVar4]);
      pVVar2 = (ValueType *)operator_new(8);
      VVar3 = ToWabtValueType(kind);
      *pVVar2 = VVar3;
      out->data[uVar4] = (wasm_valtype_t *)pVVar2;
      uVar4 = uVar4 + 1;
      pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(types->
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 3));
  }
  return;
}

Assistant:

static void FromWabtValueTypes(const ValueTypes& types,
                               wasm_valtype_vec_t* out) {
  wasm_valtype_vec_new_uninitialized(out, types.size());
  for (size_t i = 0; i < types.size(); ++i) {
    out->data[i] = wasm_valtype_new(FromWabtValueType(types[i]));
  }
}